

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

long remove_bb(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bb_insn_t_conflict pbVar1;
  long local_38;
  long deleted_insns_num;
  bb_insn_t_conflict next_bb_insn;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t insn;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  local_38 = 0;
  if (bb->index != 2) {
    if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"  BB%lu is unreachable and removed\n",bb->index);
    }
    next_bb_insn = DLIST_bb_insn_t_head(&bb->bb_insns);
    while (next_bb_insn != (bb_insn_t_conflict)0x0) {
      pbVar1 = DLIST_bb_insn_t_next(next_bb_insn);
      gen_delete_insn(gen_ctx,next_bb_insn->insn);
      local_38 = local_38 + 1;
      next_bb_insn = pbVar1;
    }
    delete_bb(gen_ctx,bb);
    return local_38;
  }
  __assert_fail("bb->index != 2",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1051,"long remove_bb(gen_ctx_t, bb_t)");
}

Assistant:

static long remove_bb (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, next_bb_insn;
  long deleted_insns_num = 0;

  gen_assert (bb->index != 2);
  DEBUG (2, {
    fprintf (debug_file, "  BB%lu is unreachable and removed\n", (unsigned long) bb->index);
  });
  for (bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = next_bb_insn) {
    next_bb_insn = DLIST_NEXT (bb_insn_t, bb_insn);
    insn = bb_insn->insn;
    gen_delete_insn (gen_ctx, insn);
    deleted_insns_num++;
  }
  delete_bb (gen_ctx, bb);
  return deleted_insns_num;
}